

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O3

diff_t __thiscall
absl::lts_20240722::time_internal::cctz::detail::difference
          (detail *this,int param_2,year_t param_3,int param_4)

{
  diff_t dVar1;
  
  dVar1 = impl::day_difference
                    ((year_t)this,(month_t)param_2,(day_t)((uint)param_2 >> 8),param_3,
                     (month_t)param_4,(day_t)((uint)param_4 >> 8));
  return ((long)((int)(char)((uint)param_2 >> 0x10) - (int)(char)((uint)param_4 >> 0x10)) +
         dVar1 * 0x18) * 0x3c + (long)((param_2 >> 0x18) - (param_4 >> 0x18));
}

Assistant:

CONSTEXPR_F diff_t difference(minute_tag, fields f1, fields f2) noexcept {
  return impl::scale_add(difference(hour_tag{}, f1, f2), 60, (f1.mm - f2.mm));
}